

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invert.c
# Opt level: O0

OPJ_BOOL opj_matrix_inversion_f
                   (OPJ_FLOAT32 *pSrcMatrix,OPJ_FLOAT32 *pDestMatrix,OPJ_UINT32 nb_compo)

{
  OPJ_BOOL OVar1;
  OPJ_UINT32 *permutations;
  OPJ_FLOAT32 *p_swap_area;
  OPJ_FLOAT32 *l_double_data;
  OPJ_UINT32 *lPermutations;
  OPJ_UINT32 l_total_size;
  OPJ_UINT32 l_swap_size;
  OPJ_UINT32 l_permutation_size;
  OPJ_BYTE *l_data;
  OPJ_UINT32 nb_compo_local;
  OPJ_FLOAT32 *pDestMatrix_local;
  OPJ_FLOAT32 *pSrcMatrix_local;
  
  permutations = (OPJ_UINT32 *)opj_malloc((ulong)(nb_compo * 0x10));
  if (permutations == (OPJ_UINT32 *)0x0) {
    pSrcMatrix_local._4_4_ = 0;
  }
  else {
    p_swap_area = (OPJ_FLOAT32 *)((long)permutations + (ulong)(nb_compo * 4));
    memset(permutations,0,(ulong)(nb_compo * 4));
    OVar1 = opj_lupDecompose(pSrcMatrix,permutations,p_swap_area,nb_compo);
    if (OVar1 == 0) {
      opj_free(permutations);
      pSrcMatrix_local._4_4_ = 0;
    }
    else {
      opj_lupInvert(pSrcMatrix,pDestMatrix,nb_compo,permutations,p_swap_area,p_swap_area + nb_compo,
                    p_swap_area + (nb_compo << 1));
      opj_free(permutations);
      pSrcMatrix_local._4_4_ = 1;
    }
  }
  return pSrcMatrix_local._4_4_;
}

Assistant:

OPJ_BOOL opj_matrix_inversion_f(OPJ_FLOAT32 * pSrcMatrix,
                                OPJ_FLOAT32 * pDestMatrix,
                                OPJ_UINT32 nb_compo)
{
    OPJ_BYTE * l_data = 00;
    OPJ_UINT32 l_permutation_size = nb_compo * (OPJ_UINT32)sizeof(OPJ_UINT32);
    OPJ_UINT32 l_swap_size = nb_compo * (OPJ_UINT32)sizeof(OPJ_FLOAT32);
    OPJ_UINT32 l_total_size = l_permutation_size + 3 * l_swap_size;
    OPJ_UINT32 * lPermutations = 00;
    OPJ_FLOAT32 * l_double_data = 00;

    l_data = (OPJ_BYTE *) opj_malloc(l_total_size);
    if (l_data == 0) {
        return OPJ_FALSE;
    }
    lPermutations = (OPJ_UINT32 *) l_data;
    l_double_data = (OPJ_FLOAT32 *)(l_data + l_permutation_size);
    memset(lPermutations, 0, l_permutation_size);

    if (! opj_lupDecompose(pSrcMatrix, lPermutations, l_double_data, nb_compo)) {
        opj_free(l_data);
        return OPJ_FALSE;
    }

    opj_lupInvert(pSrcMatrix, pDestMatrix, nb_compo, lPermutations, l_double_data,
                  l_double_data + nb_compo, l_double_data + 2 * nb_compo);
    opj_free(l_data);

    return OPJ_TRUE;
}